

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Empty_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Empty_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  undefined1 uVar2;
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_01;
  allocator_type *alloc;
  long in_RDI;
  AssertionResult gtest_ar__3;
  TypeParam empty_ht;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  undefined4 in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd7c;
  HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd90;
  undefined8 in_stack_fffffffffffffd98;
  int iVar3;
  key_equal *eql;
  char *in_stack_fffffffffffffda0;
  hasher *hf;
  undefined8 in_stack_fffffffffffffda8;
  Type TVar4;
  Alloc<int,_unsigned_long,_18446744073709551615UL> *this_02;
  AssertHelper *in_stack_fffffffffffffdb0;
  string local_240 [32];
  char *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  AssertionResult *in_stack_fffffffffffffdf8;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffe00;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_1c8;
  hasher local_1b8;
  key_equal local_1ac [11];
  string local_120 [55];
  undefined1 local_e9;
  AssertionResult local_e8;
  string local_d8 [55];
  byte local_a1;
  AssertionResult local_a0 [3];
  value_type local_64;
  string local_60 [71];
  undefined1 local_19;
  AssertionResult local_18;
  
  TVar4 = (Type)((ulong)in_stack_fffffffffffffda8 >> 0x20);
  iVar3 = (int)((ulong)in_stack_fffffffffffffd98 >> 0x20);
  local_19 = google::
             BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::empty((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xc53ed5);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffffd80,
             (bool *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),(type *)0xc53ef7)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffdb0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffdf8,
               (char *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
               in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffdb0,TVar4,in_stack_fffffffffffffda0,iVar3,
               in_stack_fffffffffffffd90);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffe00._M_head_impl,
               (Message *)in_stack_fffffffffffffdf8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd80);
    std::__cxx11::string::~string(local_60);
    testing::Message::~Message((Message *)0xc53fb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc5404f);
  this_00 = (HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)(in_RDI + 0x10);
  local_64 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)in_stack_fffffffffffffe00._M_head_impl,(value_type *)in_stack_fffffffffffffdf8);
  bVar1 = google::
          BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::empty((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   *)0xc54099);
  local_a1 = (bVar1 ^ 0xffU) & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffffd80,
             (bool *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),(type *)0xc540bd)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffdf8,
               (char *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
               in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,TVar4,in_stack_fffffffffffffda0,iVar3,
               in_stack_fffffffffffffd90);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffe00._M_head_impl,
               (Message *)in_stack_fffffffffffffdf8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd80);
    std::__cxx11::string::~string(local_d8);
    testing::Message::~Message((Message *)0xc54190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc54224);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::clear((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *)0xc54232);
  local_e9 = google::
             BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::empty((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xc54240);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffffd80,
             (bool *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),(type *)0xc54262)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffdf8,
               (char *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
               in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,TVar4,in_stack_fffffffffffffda0,iVar3,
               in_stack_fffffffffffffd90);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffe00._M_head_impl,
               (Message *)in_stack_fffffffffffffdf8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd80);
    std::__cxx11::string::~string(local_120);
    testing::Message::~Message((Message *)0xc54335);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc543cc);
  eql = local_1ac;
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c);
  hf = &local_1b8;
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c);
  alloc = (allocator_type *)0x0;
  this_02 = &local_1c8;
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(this_02,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet(this_00,(size_type)this_02,hf,eql,alloc);
  TVar4 = (Type)((ulong)this_02 >> 0x20);
  iVar3 = (int)((ulong)eql >> 0x20);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_1c8);
  this_01 = (HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)(in_RDI + 0x10);
  HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(this_01,in_stack_fffffffffffffd7c);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)in_stack_fffffffffffffe00._M_head_impl,(value_type *)in_stack_fffffffffffffdf8);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::swap((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)this_01,
         (BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  uVar2 = google::
          BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::empty((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   *)0xc544b5);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_01,
             (bool *)CONCAT44(CONCAT13(uVar2,(int3)in_stack_fffffffffffffd7c),
                              in_stack_fffffffffffffd78),(type *)0xc544db);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffdf8);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffdf8,(char *)CONCAT17(uVar2,in_stack_fffffffffffffdf0),
               in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,TVar4,(char *)hf,iVar3,(char *)alloc);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffe00._M_head_impl,
               (Message *)in_stack_fffffffffffffdf8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string(local_240);
    testing::Message::~Message((Message *)0xc545d4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc5465c);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xc54669);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Empty) {
  EXPECT_TRUE(this->ht_.empty());

  this->ht_.insert(this->UniqueObject(1));
  EXPECT_FALSE(this->ht_.empty());

  this->ht_.clear();
  EXPECT_TRUE(this->ht_.empty());

  TypeParam empty_ht;
  this->ht_.insert(this->UniqueObject(1));
  this->ht_.swap(empty_ht);
  EXPECT_TRUE(this->ht_.empty());
}